

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XFileParser.cpp
# Opt level: O3

void __thiscall Assimp::XFileParser::ParseDataObjectMeshMaterialList(XFileParser *this,Mesh *pMesh)

{
  pointer *ppuVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char *pcVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  Logger *this_00;
  uint *__args;
  iterator iVar8;
  string objectName;
  string matName;
  value_type local_e0;
  string local_70;
  string local_50;
  
  readHeadOfDataObject(this,(string *)0x0);
  ReadInt(this);
  uVar4 = ReadInt(this);
  if ((uVar4 != 1) &&
     (((long)(pMesh->mPosFaces).
             super__Vector_base<Assimp::XFile::Face,_std::allocator<Assimp::XFile::Face>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)(pMesh->mPosFaces).
             super__Vector_base<Assimp::XFile::Face,_std::allocator<Assimp::XFile::Face>_>._M_impl.
             super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 - (ulong)uVar4 != 0)) {
    local_e0.mName._M_dataplus._M_p = (pointer)&local_e0.mName.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e0,"Per-Face material index count does not match face count.","");
    ThrowException(this,&local_e0.mName);
  }
  if (uVar4 != 0) {
    do {
      uVar5 = ReadInt(this);
      local_e0.mName._M_dataplus._M_p._0_4_ = uVar5;
      iVar8._M_current =
           (pMesh->mFaceMaterials).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar8._M_current ==
          (pMesh->mFaceMaterials).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                  (&pMesh->mFaceMaterials,iVar8,(uint *)&local_e0);
      }
      else {
        *iVar8._M_current = uVar5;
        ppuVar1 = &(pMesh->mFaceMaterials).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppuVar1 = *ppuVar1 + 1;
      }
      uVar4 = uVar4 - 1;
    } while (uVar4 != 0);
  }
  if (((this->mIsBinaryFormat == false) && (pcVar3 = this->mP, pcVar3 < this->mEnd)) &&
     (*pcVar3 == ';')) {
    this->mP = pcVar3 + 1;
  }
  iVar8._M_current =
       (pMesh->mFaceMaterials).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  __args = (pMesh->mFaceMaterials).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)iVar8._M_current - (long)__args >> 2) <
      (ulong)(((long)(pMesh->mPosFaces).
                     super__Vector_base<Assimp::XFile::Face,_std::allocator<Assimp::XFile::Face>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(pMesh->mPosFaces).
                     super__Vector_base<Assimp::XFile::Face,_std::allocator<Assimp::XFile::Face>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555)) {
    do {
      if (iVar8._M_current ==
          (pMesh->mFaceMaterials).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)&pMesh->mFaceMaterials,iVar8
                   ,__args);
        iVar8._M_current =
             (pMesh->mFaceMaterials).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
             ._M_impl.super__Vector_impl_data._M_finish;
      }
      else {
        *iVar8._M_current = *__args;
        iVar8._M_current =
             (pMesh->mFaceMaterials).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
        (pMesh->mFaceMaterials).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_finish = iVar8._M_current;
      }
      __args = (pMesh->mFaceMaterials).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
    } while ((ulong)((long)iVar8._M_current - (long)__args >> 2) <
             (ulong)(((long)(pMesh->mPosFaces).
                            super__Vector_base<Assimp::XFile::Face,_std::allocator<Assimp::XFile::Face>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(pMesh->mPosFaces).
                            super__Vector_base<Assimp::XFile::Face,_std::allocator<Assimp::XFile::Face>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555));
  }
  paVar2 = &local_e0.mName.field_2;
  do {
    GetNextToken_abi_cxx11_(&local_70,this);
    if (local_70._M_string_length == 0) {
      local_e0.mName._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_e0,"Unexpected end of file while parsing mesh material list.","");
      ThrowException(this,&local_e0.mName);
    }
    iVar6 = std::__cxx11::string::compare((char *)&local_70);
    if (iVar6 != 0) {
      iVar7 = std::__cxx11::string::compare((char *)&local_70);
      if (iVar7 == 0) {
        GetNextToken_abi_cxx11_(&local_50,this);
        local_e0.mName._M_string_length = 0;
        local_e0.mName.field_2._M_local_buf[0] = '\0';
        local_e0.mTextures.
        super__Vector_base<Assimp::XFile::TexEntry,_std::allocator<Assimp::XFile::TexEntry>_>.
        _M_impl.super__Vector_impl_data._4_8_ = 0;
        local_e0.mTextures.
        super__Vector_base<Assimp::XFile::TexEntry,_std::allocator<Assimp::XFile::TexEntry>_>.
        _M_impl.super__Vector_impl_data._12_8_ = 0;
        local_e0.mEmissive.r = 0.0;
        local_e0.mEmissive.g = 0.0;
        local_e0._76_8_ = 0;
        local_e0.mSpecularExponent = 0.0;
        local_e0.mSpecular.r = 0.0;
        local_e0.mSpecular.g = 0.0;
        local_e0.mSpecular.b = 0.0;
        local_e0.mDiffuse.r = 0.0;
        local_e0.mDiffuse.g = 0.0;
        local_e0.mDiffuse.b = 0.0;
        local_e0.mDiffuse.a = 0.0;
        local_e0.mTextures.
        super__Vector_base<Assimp::XFile::TexEntry,_std::allocator<Assimp::XFile::TexEntry>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
        local_e0.sceneIndex = 0xffffffffffffffff;
        local_e0.mIsReference = true;
        local_e0.mName._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_assign((string *)&local_e0);
        std::vector<Assimp::XFile::Material,_std::allocator<Assimp::XFile::Material>_>::push_back
                  (&pMesh->mMaterials,&local_e0);
        CheckForClosingBrace(this);
        std::vector<Assimp::XFile::TexEntry,_std::allocator<Assimp::XFile::TexEntry>_>::~vector
                  (&local_e0.mTextures);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0.mName._M_dataplus._M_p != paVar2) {
          operator_delete(local_e0.mName._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
      }
      else {
        iVar7 = std::__cxx11::string::compare((char *)&local_70);
        if (iVar7 == 0) {
          local_e0.mName._M_string_length = 0;
          local_e0.mName.field_2._M_local_buf[0] = '\0';
          local_e0.mIsReference = false;
          local_e0.mTextures.
          super__Vector_base<Assimp::XFile::TexEntry,_std::allocator<Assimp::XFile::TexEntry>_>.
          _M_impl.super__Vector_impl_data._4_8_ = 0;
          local_e0.mTextures.
          super__Vector_base<Assimp::XFile::TexEntry,_std::allocator<Assimp::XFile::TexEntry>_>.
          _M_impl.super__Vector_impl_data._12_8_ = 0;
          local_e0.mEmissive.r = 0.0;
          local_e0.mEmissive.g = 0.0;
          local_e0._76_8_ = 0;
          local_e0.mSpecularExponent = 0.0;
          local_e0.mSpecular.r = 0.0;
          local_e0.mSpecular.g = 0.0;
          local_e0.mSpecular.b = 0.0;
          local_e0.mDiffuse.r = 0.0;
          local_e0.mDiffuse.g = 0.0;
          local_e0.mDiffuse.b = 0.0;
          local_e0.mDiffuse.a = 0.0;
          local_e0.mTextures.
          super__Vector_base<Assimp::XFile::TexEntry,_std::allocator<Assimp::XFile::TexEntry>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
          local_e0.sceneIndex = 0xffffffffffffffff;
          local_e0.mName._M_dataplus._M_p = (pointer)paVar2;
          std::vector<Assimp::XFile::Material,_std::allocator<Assimp::XFile::Material>_>::
          emplace_back<Assimp::XFile::Material>(&pMesh->mMaterials,&local_e0);
          std::vector<Assimp::XFile::TexEntry,_std::allocator<Assimp::XFile::TexEntry>_>::~vector
                    (&local_e0.mTextures);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0.mName._M_dataplus._M_p != paVar2) {
            operator_delete(local_e0.mName._M_dataplus._M_p);
          }
          ParseDataObjectMaterial
                    (this,(pMesh->mMaterials).
                          super__Vector_base<Assimp::XFile::Material,_std::allocator<Assimp::XFile::Material>_>
                          ._M_impl.super__Vector_impl_data._M_finish + -1);
        }
        else {
          iVar7 = std::__cxx11::string::compare((char *)&local_70);
          if (iVar7 != 0) {
            this_00 = DefaultLogger::get();
            Logger::warn(this_00,"Unknown data object in material list in x file");
            ParseUnknownDataObject(this);
          }
        }
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
  } while (iVar6 != 0);
  return;
}

Assistant:

void XFileParser::ParseDataObjectMeshMaterialList( Mesh* pMesh)
{
    readHeadOfDataObject();

    // read material count
    /*unsigned int numMaterials =*/ ReadInt();
    // read non triangulated face material index count
    unsigned int numMatIndices = ReadInt();

    // some models have a material index count of 1... to be able to read them we
    // replicate this single material index on every face
    if( numMatIndices != pMesh->mPosFaces.size() && numMatIndices != 1)
        ThrowException( "Per-Face material index count does not match face count.");

    // read per-face material indices
    for( unsigned int a = 0; a < numMatIndices; a++)
        pMesh->mFaceMaterials.push_back( ReadInt());

    // in version 03.02, the face indices end with two semicolons.
    // commented out version check, as version 03.03 exported from blender also has 2 semicolons
    if( !mIsBinaryFormat) // && MajorVersion == 3 && MinorVersion <= 2)
    {
        if(mP < mEnd && *mP == ';')
            ++mP;
    }

    // if there was only a single material index, replicate it on all faces
    while( pMesh->mFaceMaterials.size() < pMesh->mPosFaces.size())
        pMesh->mFaceMaterials.push_back( pMesh->mFaceMaterials.front());

    // read following data objects
    bool running = true;
    while ( running )
    {
        std::string objectName = GetNextToken();
        if( objectName.size() == 0)
            ThrowException( "Unexpected end of file while parsing mesh material list.");
        else
        if( objectName == "}")
            break; // material list finished
        else
        if( objectName == "{")
        {
            // template materials
            std::string matName = GetNextToken();
            Material material;
            material.mIsReference = true;
            material.mName = matName;
            pMesh->mMaterials.push_back( material);

            CheckForClosingBrace(); // skip }
        } else
        if( objectName == "Material")
        {
            pMesh->mMaterials.push_back( Material());
            ParseDataObjectMaterial( &pMesh->mMaterials.back());
        } else
        if( objectName == ";")
        {
            // ignore
        } else
        {
            ASSIMP_LOG_WARN("Unknown data object in material list in x file");
            ParseUnknownDataObject();
        }
    }
}